

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

int __thiscall crnlib::dxt_image::init(dxt_image *this,EVP_PKEY_CTX *ctx)

{
  element *__s;
  bool bVar1;
  undefined7 extraout_var;
  uint in_ECX;
  uint in_EDX;
  char in_R8B;
  
  bVar1 = init_internal(this,(dxt_format)ctx,in_EDX,in_ECX);
  if (bVar1) {
    vector<crnlib::dxt_image::element>::resize(&this->m_elements,this->m_total_elements,false);
    __s = (this->m_elements).m_p;
    this->m_pElements = __s;
    if (in_R8B != '\0') {
      memset(__s,0,(ulong)this->m_total_elements << 3);
    }
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool dxt_image::init(dxt_format fmt, uint width, uint height, bool clear_elements)
    {
        if (!init_internal(fmt, width, height))
        {
            return false;
        }

        m_elements.resize(m_total_elements);
        m_pElements = &m_elements[0];

        if (clear_elements)
        {
            memset(m_pElements, 0, sizeof(element) * m_total_elements);
        }

        return true;
    }